

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelLight.cpp
# Opt level: O3

Color __thiscall ParallelLight::diffuse(ParallelLight *this,vec3 hitpoint,shared_ptr<Obj> *object)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  vec4 left;
  vec4 right;
  Color result;
  Color local_c;
  
  iVar2 = (*((object->super___shared_ptr<Obj,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Obj[2])
                    (hitpoint.field_0._0_4_);
  left.field_0.field_0.y = (float)extraout_var;
  left.field_0.field_0.x = (float)iVar2;
  right.field_0.field_0.y = 0.0 - *(float *)&this->field_0x10;
  right.field_0.field_0.x = 0.0 - *(float *)&(this->super_Light).field_0xc;
  right.field_0.field_0.w = 0.0 - *(float *)&this->field_0x18;
  right.field_0.field_0.z = 0.0 - *(float *)&this->field_0x14;
  left.field_0._8_8_ = extraout_RDX;
  dVar1 = Obj::dot(left,right);
  dVar1 = dVar1 * 255.0;
  Color::Color(&local_c,dVar1,dVar1,dVar1);
  return local_c;
}

Assistant:

Color ParallelLight::diffuse(glm::vec3 hitpoint, std::shared_ptr<Obj> object) {
    glm::vec4 normal = object->getNormal(hitpoint);
    double diffuseFactor = Obj::dot(normal, -direction);
    Color result(diffuseFactor * 255, diffuseFactor * 255, diffuseFactor * 255);
    return result;
}